

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# docopt.cpp
# Opt level: O2

Required *
parse_pattern(Required *__return_storage_ptr__,string *source,
             vector<docopt::Option,_std::allocator<docopt::Option>_> *options)

{
  pointer psVar1;
  pointer psVar2;
  pointer psVar3;
  DocoptLanguageError *this;
  Tokens tokens;
  PatternList local_b8;
  string local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
  local_38;
  
  Tokens::from_pattern(&tokens,source);
  parse_expr(&local_b8,&tokens,options);
  psVar3 = local_b8.
           super__Vector_base<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage;
  psVar2 = local_b8.
           super__Vector_base<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  psVar1 = local_b8.
           super__Vector_base<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if ((ulong)((long)tokens.fTokens.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
              (long)tokens.fTokens.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start >> 5) <= tokens.fIndex) {
    local_b8.
    super__Vector_base<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_b8.
    super__Vector_base<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_b8.
    super__Vector_base<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    (__return_storage_ptr__->super_BranchPattern).fChildren.
    super__Vector_base<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
    ._M_impl.super__Vector_impl_data._M_start = psVar1;
    (__return_storage_ptr__->super_BranchPattern).fChildren.
    super__Vector_base<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = psVar2;
    local_38.
    super__Vector_base<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    (__return_storage_ptr__->super_BranchPattern).fChildren.
    super__Vector_base<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = psVar3;
    local_38.
    super__Vector_base<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_38.
    super__Vector_base<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    (__return_storage_ptr__->super_BranchPattern).super_Pattern._vptr_Pattern =
         (_func_int **)&PTR_flat_001d7490;
    std::
    vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>::
    ~vector(&local_38);
    std::
    vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>::
    ~vector(&local_b8);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&tokens.fTokens);
    return __return_storage_ptr__;
  }
  this = (DocoptLanguageError *)__cxa_allocate_exception(0x10);
  Tokens::the_rest_abi_cxx11_(&local_98,&tokens);
  std::operator+(&local_78,"Unexpected ending: \'",&local_98);
  std::operator+(&local_58,&local_78,"\'");
  docopt::DocoptLanguageError::runtime_error(this,&local_58);
  __cxa_throw(this,&docopt::DocoptLanguageError::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

Required parse_pattern(std::string const& source, std::vector<Option>& options)
{
	auto tokens = Tokens::from_pattern(source);
	auto result = parse_expr(tokens, options);
	
	if (tokens)
		throw DocoptLanguageError("Unexpected ending: '" + tokens.the_rest() + "'");
	
	assert(result.size() == 1  &&  "top level is always one big");
	return Required{ std::move(result) };
}